

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O3

void Am_Choice_List_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Slot_Flags set_flags;
  Am_Object new_object;
  Am_Object ref_object;
  Am_Choice_How_Set how_set;
  Am_Value_List old_value_list;
  Am_Value old_value;
  Am_Value_List new_value;
  Am_Object local_60;
  Am_Value_List local_58;
  Am_Object local_48;
  Am_Value_List local_40;
  Am_Value local_30;
  Am_Value_List local_20;
  
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  if ((pAVar2->type != 1) && (pAVar2->type != Am_Choice_How_Set::Am_Choice_How_Set_ID)) {
    Am_Choice_How_Set::TypeError((Am_Choice_How_Set *)&local_58.item,pAVar2);
  }
  local_58.item = *(Am_List_Item **)&pAVar2->value;
  pAVar2 = Am_Object::Get(inter,0x169,3);
  Am_Value::Am_Value(&local_30,pAVar2);
  Am_Value_List::Am_Value_List(&local_40);
  bVar1 = Am_Value_List::Test(&local_30);
  if (bVar1) {
    Am_Value_List::operator=(&local_40,&local_30);
  }
  else if (local_30.type == 0xa001) {
    Am_Value_List::Add(&local_40,&local_30,Am_TAIL,true);
  }
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::Am_Object(&local_60,pAVar2);
  if (local_58.item == (Am_List_Item *)Am_CHOICE_LIST_TOGGLE.value) {
    pAVar2 = Am_Object::Get(inter,0x12e,0);
    Am_Object::Am_Object((Am_Object *)&local_58,pAVar2);
    pAVar2 = Am_Object::Get(inter,0x11b,0);
    if (((pAVar2->value).wrapper_value != (Am_Wrapper *)0x0) &&
       (pAVar2->type != Am_Input_Char::Am_Input_Char_ID)) {
      Am_Error();
    }
    bVar1 = Am_Object::Valid((Am_Object *)&local_58);
    if (bVar1) {
      bVar1 = Am_Object::Valid(&local_60);
      if (!bVar1) {
        pAVar2 = Am_Object::Get(inter,0x1ef,0);
        Am_Object::operator=(&local_60,pAVar2);
      }
    }
    else {
      Am_Object::operator=((Am_Object *)&local_58,&local_60);
    }
    list_final_value((Am_Object *)&local_20,inter,&local_60,&local_58,SUB81(&local_40,0));
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_20);
    Am_Object::Set(inter,0x169,pAVar3,1);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_58);
    Am_Object::Set(inter,0x16d,pAVar3,1);
    Am_Value_List::~Am_Value_List(&local_20);
    Am_Object::~Am_Object((Am_Object *)&local_58);
    goto LAB_00232c95;
  }
  Am_Object::Set(&local_60,0x173,false,1);
  Am_Value_List::Start(&local_40);
  if (local_58.item == (Am_List_Item *)Am_CHOICE_TOGGLE.value) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
    bVar1 = Am_Value_List::Member(&local_40,pAVar3);
    if (!bVar1) goto LAB_00232b86;
LAB_00232b93:
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
    set_flags = 0;
  }
  else {
LAB_00232b86:
    if (local_58.item == (Am_List_Item *)Am_CHOICE_CLEAR.value) goto LAB_00232b93;
    bVar1 = Am_Object::Valid(&local_60);
    if (bVar1) {
      Am_Object::Set(&local_60,0x172,true,1);
    }
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
    set_flags = 1;
  }
  Am_Object::Set(inter,0x169,pAVar3,set_flags);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
  Am_Object::Set(inter,0x16d,pAVar3,1);
LAB_00232c95:
  Am_Object::Set(inter,0x16c,&local_30,1);
  Am_Object::Am_Object(&local_48,inter);
  Am_Copy_Values_To_Command(&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_60);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Do, (Am_Object inter))
{
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  Am_Value old_value = inter.Get(Am_VALUE, Am_RETURN_ZERO_ON_ERROR);
  Am_Value_List old_value_list;
  if (Am_Value_List::Test(old_value))
    old_value_list = old_value;
  else if (old_value.type == Am_OBJECT)
    old_value_list.Add(old_value);
  Am_Object new_object = inter.Get(Am_INTERIM_VALUE);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Object ref_object = inter.Get(Am_INITIAL_REF_OBJECT);
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    bool separate_extend = ic.control;
    if (!ref_object.Valid())
      ref_object = new_object;
    else if (!new_object.Valid())
      new_object = inter.Get(Am_LAST_USED_OLD_INTERIM_VALUE);
    // clears interim value and sets new value
    Am_Value_List new_value = list_final_value(inter, new_object, ref_object,
                                               old_value_list, separate_extend);
    inter.Set(Am_VALUE, new_value, Am_OK_IF_NOT_THERE);
    inter.Set(Am_OBJECT_MODIFIED, ref_object, Am_OK_IF_NOT_THERE);
  } else {
    Am_REPORT_SET_SEL_VALUE(false, inter, new_object, false);
    new_object.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    old_value_list.Start();
    if ((how_set == Am_CHOICE_TOGGLE && old_value_list.Member(new_object)) ||
        how_set == Am_CHOICE_CLEAR)
      inter.Set(Am_VALUE, Am_No_Object); // empty
    else {
      if (new_object.Valid()) {
        Am_REPORT_SET_SEL_VALUE(true, inter, new_object, true);
        new_object.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
      inter.Set(Am_VALUE, new_object, Am_OK_IF_NOT_THERE);
    }
    inter.Set(Am_OBJECT_MODIFIED, new_object, Am_OK_IF_NOT_THERE);
  }
  inter.Set(Am_OLD_VALUE, old_value, Am_OK_IF_NOT_THERE);
  Am_Copy_Values_To_Command(inter);
}